

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

void wabt::anon_unknown_0::FloatParser<float>::ParseInfinity(char *s,char *end,Uint *out_bits)

{
  bool bVar1;
  Uint UVar2;
  bool local_21;
  bool is_neg;
  Uint *out_bits_local;
  char *end_local;
  char *s_local;
  
  local_21 = false;
  if (*s == '-') {
    local_21 = true;
    end_local = s + 1;
  }
  else {
    end_local = s;
    if (*s == '+') {
      end_local = s + 1;
    }
  }
  bVar1 = StringStartsWith(end_local,end,"inf");
  if (bVar1) {
    UVar2 = Make(local_21,0x80,0);
    *out_bits = UVar2;
    return;
  }
  __assert_fail("StringStartsWith(s, end, \"inf\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/literal.cc"
                ,0x1a4,
                "static void wabt::(anonymous namespace)::FloatParser<float>::ParseInfinity(const char *, const char *, Uint *) [T = float]"
               );
}

Assistant:

void FloatParser<T>::ParseInfinity(const char* s,
                                   const char* end,
                                   Uint* out_bits) {
  bool is_neg = false;
  if (*s == '-') {
    is_neg = true;
    s++;
  } else if (*s == '+') {
    s++;
  }
  assert(StringStartsWith(s, end, "inf"));
  *out_bits = Make(is_neg, Traits::kMaxExp, 0);
}